

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__newparam____gles_newparam_type
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  newparam____gles_newparam_type__AttributeData *elementHash;
  StringHash SVar2;
  undefined8 *puVar3;
  undefined8 in_RCX;
  ParserTemplateBase *in_RDX;
  long *in_RSI;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  newparam____gles_newparam_type__AttributeData *attributeData;
  ParserChar *in_stack_00000098;
  ParserChar *in_stack_000000a0;
  StringHash in_stack_000000a8;
  ErrorType in_stack_000000b0;
  Severity in_stack_000000b4;
  ParserTemplateBase *in_stack_000000b8;
  void **in_stack_ffffffffffffffb8;
  ParserTemplateBase *in_stack_ffffffffffffffc0;
  undefined8 *attributeHash;
  bool local_1;
  
  elementHash = GeneratedSaxParser::ParserTemplateBase::
                newData<COLLADASaxFWL15::newparam____gles_newparam_type__AttributeData>
                          (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  attributeHash = (undefined8 *)*in_RSI;
  if (attributeHash == (undefined8 *)0x0) {
LAB_009eeee2:
    if ((elementHash->sid == (ParserChar *)0x0) &&
       (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (in_RDX,(Severity)((ulong)in_RCX >> 0x20),(ErrorType)in_RCX,
                           (StringHash)elementHash,(StringHash)attributeHash,
                           (ParserChar *)in_stack_ffffffffffffffc0), bVar1)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    do {
      while( true ) {
        if ((ParserChar *)*attributeHash == (ParserChar *)0x0) {
          in_stack_ffffffffffffffc0 = (ParserTemplateBase *)0x0;
          goto LAB_009eeee2;
        }
        SVar2 = GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)*attributeHash);
        puVar3 = attributeHash + 1;
        if (puVar3 == (undefined8 *)0x0) {
          return false;
        }
        attributeHash = attributeHash + 2;
        if (SVar2 != 0x79f4) break;
        elementHash->sid = (ParserChar *)*puVar3;
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000a8,
                         in_stack_000000a0,in_stack_00000098);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__newparam____gles_newparam_type( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__newparam____gles_newparam_type( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

newparam____gles_newparam_type__AttributeData* attributeData = newData<newparam____gles_newparam_type__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_SID:
    {

attributeData->sid = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__sid_type(attributeData->sid, strlen(attributeData->sid));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_NEWPARAM,
            HASH_ATTRIBUTE_SID,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_NEWPARAM, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( !attributeData->sid )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_NEWPARAM, HASH_ATTRIBUTE_SID, 0 ) )
        return false;
}


    return true;
}